

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3ReadEndBlockField(sqlite3_stmt *pStmt,int iCol,i64 *piEndBlock,i64 *pnByte)

{
  uchar *puVar1;
  long *in_RCX;
  long *in_RDX;
  u64 iVal;
  int iMul;
  int i;
  uchar *zText;
  int in_stack_ffffffffffffffbc;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar2;
  long local_38;
  int local_30;
  int local_2c;
  
  puVar1 = sqlite3_column_text((sqlite3_stmt *)
                               CONCAT17(in_stack_ffffffffffffffc7,
                                        CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0
                                                )),in_stack_ffffffffffffffbc);
  if (puVar1 != (uchar *)0x0) {
    local_30 = 1;
    local_38 = 0;
    local_2c = 0;
    while( true ) {
      bVar2 = false;
      if (0x2f < puVar1[local_2c]) {
        bVar2 = puVar1[local_2c] < 0x3a;
      }
      if (!bVar2) break;
      local_38 = local_38 * 10 + (long)(int)(puVar1[local_2c] - 0x30);
      local_2c = local_2c + 1;
    }
    *in_RDX = local_38;
    for (; puVar1[local_2c] == ' '; local_2c = local_2c + 1) {
    }
    local_38 = 0;
    if (puVar1[local_2c] == '-') {
      local_2c = local_2c + 1;
      local_30 = -1;
    }
    while( true ) {
      bVar2 = false;
      if (0x2f < puVar1[local_2c]) {
        bVar2 = puVar1[local_2c] < 0x3a;
      }
      if (!bVar2) break;
      local_38 = local_38 * 10 + (long)(int)(puVar1[local_2c] - 0x30);
      local_2c = local_2c + 1;
    }
    *in_RCX = local_38 * local_30;
  }
  return;
}

Assistant:

static void fts3ReadEndBlockField(
  sqlite3_stmt *pStmt,
  int iCol,
  i64 *piEndBlock,
  i64 *pnByte
){
  const unsigned char *zText = sqlite3_column_text(pStmt, iCol);
  if( zText ){
    int i;
    int iMul = 1;
    u64 iVal = 0;
    for(i=0; zText[i]>='0' && zText[i]<='9'; i++){
      iVal = iVal*10 + (zText[i] - '0');
    }
    *piEndBlock = (i64)iVal;
    while( zText[i]==' ' ) i++;
    iVal = 0;
    if( zText[i]=='-' ){
      i++;
      iMul = -1;
    }
    for(/* no-op */; zText[i]>='0' && zText[i]<='9'; i++){
      iVal = iVal*10 + (zText[i] - '0');
    }
    *pnByte = ((i64)iVal * (i64)iMul);
  }
}